

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O0

void __thiscall pstack::Elf::Section::Section(Section *this,Object *elf,Off off)

{
  element_type *this_00;
  Off off_local;
  Object *elf_local;
  Section *this_local;
  
  std::shared_ptr<const_pstack::Reader>::shared_ptr(&this->io_);
  this->elf = elf;
  std::__cxx11::string::string((string *)&this->name);
  this_00 = std::__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&elf->io);
  Reader::readObj<Elf64_Shdr>(this_00,off,&this->shdr,1);
  return;
}

Assistant:

Section::Section(Object *elf, Off off) : elf(elf) {
    elf->io->readObj(off, &shdr);
}